

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O3

void floor_nz_3d(float32 ***m,uint32 d1,uint32 d2,uint32 d3,float32 floor)

{
  float fVar1;
  float32 *pfVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  if (d1 != 0) {
    uVar4 = 0;
    do {
      if (d2 != 0) {
        uVar5 = 0;
        do {
          if (d3 != 0) {
            pfVar2 = m[uVar4][uVar5];
            uVar3 = 0;
            do {
              fVar1 = (float)pfVar2[uVar3];
              if (((fVar1 != 0.0) || (NAN(fVar1))) && (fVar1 < (float)floor)) {
                pfVar2[uVar3] = floor;
              }
              uVar3 = uVar3 + 1;
            } while (d3 != uVar3);
          }
          uVar5 = uVar5 + 1;
        } while (uVar5 != d2);
      }
      uVar4 = uVar4 + 1;
    } while (uVar4 != d1);
  }
  return;
}

Assistant:

void
floor_nz_3d(float32 ***m,
	    uint32 d1,
	    uint32 d2,
	    uint32 d3,
	    float32 floor)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		if ((m[i][j][k] != 0) && (m[i][j][k] < floor))
		    m[i][j][k] = floor;
	    }
	}
    }
}